

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

void __thiscall
cbtCollisionWorld::serializeCollisionObjects(cbtCollisionWorld *this,cbtSerializer *serializer)

{
  cbtCollisionObject *pcVar1;
  ulong uVar2;
  cbtCollisionShape **ppcVar3;
  long lVar4;
  cbtCollisionShape *shape;
  cbtHashMap<cbtHashPtr,_cbtCollisionShape_*> serializedShapes;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 local_c0;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 local_b8;
  cbtHashMap<cbtHashPtr,_cbtCollisionShape_*> local_b0;
  
  local_b0.m_hashTable.m_ownsMemory = true;
  local_b0.m_hashTable.m_data = (int *)0x0;
  local_b0.m_hashTable.m_size = 0;
  local_b0.m_hashTable.m_capacity = 0;
  local_b0.m_next.m_ownsMemory = true;
  local_b0.m_next.m_data = (int *)0x0;
  local_b0.m_next.m_size = 0;
  local_b0.m_next.m_capacity = 0;
  local_b0.m_valueArray.m_ownsMemory = true;
  local_b0.m_valueArray.m_data = (cbtCollisionShape **)0x0;
  local_b0.m_valueArray.m_size = 0;
  local_b0.m_valueArray.m_capacity = 0;
  local_b0.m_keyArray.m_ownsMemory = true;
  local_b0.m_keyArray.m_data = (cbtHashPtr *)0x0;
  local_b0.m_keyArray.m_size = 0;
  local_b0.m_keyArray.m_capacity = 0;
  for (lVar4 = 0; uVar2 = (ulong)(this->m_collisionObjects).m_size, lVar4 < (long)uVar2;
      lVar4 = lVar4 + 1) {
    local_c0 = (anon_union_8_2_511b660c_for_cbtHashPtr_0)
               (this->m_collisionObjects).m_data[lVar4]->m_collisionShape;
    local_b8 = local_c0;
    ppcVar3 = cbtHashMap<cbtHashPtr,_cbtCollisionShape_*>::find(&local_b0,(cbtHashPtr *)&local_b8);
    if (ppcVar3 == (cbtCollisionShape **)0x0) {
      local_b8.m_pointer = local_c0.m_pointer;
      cbtHashMap<cbtHashPtr,_cbtCollisionShape_*>::insert
                (&local_b0,(cbtHashPtr *)&local_b8,(cbtCollisionShape **)&local_c0.m_pointer);
      (**(code **)(*local_c0.m_pointer + 0x78))(local_c0.m_pointer,serializer);
    }
  }
  for (lVar4 = 0; lVar4 < (int)uVar2; lVar4 = lVar4 + 1) {
    pcVar1 = (this->m_collisionObjects).m_data[lVar4];
    if (pcVar1->m_internalType == 1) {
      (*pcVar1->_vptr_cbtCollisionObject[6])(pcVar1,serializer);
      uVar2 = (ulong)(uint)(this->m_collisionObjects).m_size;
    }
  }
  cbtHashMap<cbtHashPtr,_cbtCollisionShape_*>::~cbtHashMap(&local_b0);
  return;
}

Assistant:

void cbtCollisionWorld::serializeCollisionObjects(cbtSerializer* serializer)
{
	int i;

	///keep track of shapes already serialized
	cbtHashMap<cbtHashPtr, cbtCollisionShape*> serializedShapes;

	for (i = 0; i < m_collisionObjects.size(); i++)
	{
		cbtCollisionObject* colObj = m_collisionObjects[i];
		cbtCollisionShape* shape = colObj->getCollisionShape();

		if (!serializedShapes.find(shape))
		{
			serializedShapes.insert(shape, shape);
			shape->serializeSingleShape(serializer);
		}
	}

	//serialize all collision objects
	for (i = 0; i < m_collisionObjects.size(); i++)
	{
		cbtCollisionObject* colObj = m_collisionObjects[i];
		if (colObj->getInternalType() == cbtCollisionObject::CO_COLLISION_OBJECT)
		{
			colObj->serializeSingleObject(serializer);
		}
	}
}